

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_trainer.cpp
# Opt level: O0

void __thiscall
Am_Gesture_Trainer_Data::Am_Gesture_Trainer_Data
          (Am_Gesture_Trainer_Data *this,Am_Gesture_Trainer_Data *d)

{
  Gesture_Class *pGVar1;
  Gesture_Class *local_40;
  Gesture_Class *last;
  Gesture_Class *to;
  Gesture_Class *from;
  Am_Gesture_Trainer_Data *d_local;
  Am_Gesture_Trainer_Data *this_local;
  
  Am_Wrapper::Am_Wrapper(&this->super_Am_Wrapper);
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_00410290;
  Am_Gesture_Classifier::Am_Gesture_Classifier(&this->cached_classifier);
  if (d->head == (Gesture_Class *)0x0) {
    this->tail = (Gesture_Class *)0x0;
    this->head = (Gesture_Class *)0x0;
  }
  else {
    pGVar1 = (Gesture_Class *)operator_new(0x28);
    Gesture_Class::Gesture_Class(pGVar1,d->head);
    this->head = pGVar1;
    this->head->prev = (Gesture_Class *)0x0;
    local_40 = this->head;
    for (to = d->head->next; to != (Gesture_Class *)0x0; to = to->next) {
      pGVar1 = (Gesture_Class *)operator_new(0x28);
      Gesture_Class::Gesture_Class(pGVar1,to);
      local_40->next = pGVar1;
      pGVar1->prev = local_40;
      local_40 = pGVar1;
    }
    local_40->next = (Gesture_Class *)0x0;
    this->tail = local_40;
  }
  this->nclasses = d->nclasses;
  Am_Gesture_Classifier::operator=(&this->cached_classifier,&d->cached_classifier);
  return;
}

Assistant:

Am_Gesture_Trainer_Data::Am_Gesture_Trainer_Data(Am_Gesture_Trainer_Data *d)
{
  if (d->head == nullptr)
    head = tail = nullptr;
  else {
    Gesture_Class *from, *to, *last;

    head = new Gesture_Class(d->head);
    head->prev = nullptr;
    for (last = head, from = d->head->next; from != nullptr;
         last = to, from = from->next) {
      to = new Gesture_Class(from);
      last->next = to;
      to->prev = last;
    }
    last->next = nullptr;
    tail = last;
  }

  nclasses = d->nclasses;
  cached_classifier = d->cached_classifier;
}